

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecc-ssh.c
# Opt level: O1

EdwardsPoint * eddsa_public(mp_int *private_key,ssh_keyalg *alg)

{
  undefined8 *puVar1;
  BinarySink *bs;
  uint8_t val;
  ec_curve *curve;
  long *plVar2;
  mp_int *n;
  EdwardsPoint *pEVar3;
  size_t byte;
  ptrlen hash_00;
  uchar hash [114];
  undefined1 auStack_a8 [120];
  
  puVar1 = (undefined8 *)alg->extra;
  curve = (ec_curve *)(*(code *)*puVar1)();
  if (curve->type == EC_EDWARDS) {
    plVar2 = (long *)(**(code **)puVar1[1])();
    if (plVar2 != (long *)0x0) {
      (**(code **)(*plVar2 + 8))(plVar2);
    }
    if (curve->fieldBytes != 0) {
      byte = 0;
      do {
        bs = (BinarySink *)plVar2[1];
        val = mp_get_byte(private_key,byte);
        BinarySink_put_byte(bs,val);
        byte = byte + 1;
      } while (byte < curve->fieldBytes);
    }
    (**(code **)(*plVar2 + 0x18))(plVar2,auStack_a8);
    (**(code **)(*plVar2 + 0x20))(plVar2);
    hash_00.len = *(size_t *)(puVar1[1] + 0x28);
    hash_00.ptr = auStack_a8;
    n = eddsa_exponent_from_hash(hash_00,curve);
    pEVar3 = ecc_edwards_multiply((curve->field_6).e.G,n);
    mp_free(n);
    return pEVar3;
  }
  __assert_fail("curve->type == EC_EDWARDS",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/ecc-ssh.c"
                ,0x179,"EdwardsPoint *eddsa_public(mp_int *, const ssh_keyalg *)");
}

Assistant:

EdwardsPoint *eddsa_public(mp_int *private_key, const ssh_keyalg *alg)
{
    const struct ecsign_extra *extra =
        (const struct ecsign_extra *)alg->extra;
    struct ec_curve *curve = extra->curve();
    assert(curve->type == EC_EDWARDS);

    ssh_hash *h = ssh_hash_new(extra->hash);
    for (size_t i = 0; i < curve->fieldBytes; ++i)
        put_byte(h, mp_get_byte(private_key, i));

    unsigned char hash[MAX_HASH_LEN];
    ssh_hash_final(h, hash);

    mp_int *exponent = eddsa_exponent_from_hash(
        make_ptrlen(hash, extra->hash->hlen), curve);

    EdwardsPoint *toret = ecc_edwards_multiply(curve->e.G, exponent);
    mp_free(exponent);

    return toret;
}